

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O2

string * __thiscall
pstack::Context::linkResolve(string *__return_storage_ptr__,Context *this,string *name)

{
  ssize_t sVar1;
  size_type sVar2;
  int *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  char local_4c8 [8];
  char buf [1024];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  string orig;
  allocator<char> local_32;
  allocator<char> local_31;
  
  std::__cxx11::string::string((string *)local_80,name);
  while( true ) {
    sVar1 = readlink((name->_M_dataplus)._M_p,local_4c8,0x3ff);
    if ((int)sVar1 == -1) break;
    local_4c8[(int)sVar1] = '\0';
    if (local_4c8[0] == '/') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (name,local_4c8);
    }
    else {
      sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                        (name,'/',0xffffffffffffffff);
      if (sVar2 == 0xffffffffffffffff) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,local_4c8,&local_32);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&orig.field_2 + 8),name,0,sVar2 + 1);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,local_4c8,&local_31);
        std::operator+(&local_c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&orig.field_2 + 8),&local_a0);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (name,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      if (sVar2 != 0xffffffffffffffff) {
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)(orig.field_2._M_local_buf + 8));
      }
    }
  }
  piVar3 = __errno_location();
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
  if (*piVar3 == 0x16) {
    __str = name;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,__str);
  std::__cxx11::string::~string((string *)local_80);
  return __return_storage_ptr__;
}

Assistant:

std::string
Context::linkResolve(std::string name)
{
    char buf[1024];
    std::string orig = name;
    int rc;
    for (;;) {
        rc = readlink(name.c_str(), buf, sizeof buf - 1);
        // some files in /proc are links, but report "(deleted)" in the name if
        // the original has gone away. Opening such files works, and uses the
        // in-core inode, so use that if we can
        if (rc == -1) {
            return errno == EINVAL ? name : orig;
        }
        buf[rc] = 0;
        if (buf[0] != '/') {
            auto lastSlash = name.rfind('/');
            name = lastSlash == std::string::npos
               ? std::string(buf)
               : name.substr(0, lastSlash + 1) + std::string(buf);
        } else {
            name = buf;
        }
    }
    return name;
}